

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_copy_constructor_equals_self_Test::TestBody
          (ByteBufferTest_test_copy_constructor_equals_self_Test *this)

{
  undefined1 uVar1;
  char *pcVar2;
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertionResult gtest_ar;
  ByteBuffer a;
  ByteBuffer b;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&a,5);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&a);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&a);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&a);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&a);
  bidfx_public_api::tools::ByteBuffer::ReadByte();
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&b,&a);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::tools::ByteBuffer,bidfx_public_api::tools::ByteBuffer>
            ((internal *)&gtest_ar,"a","b",&a,&b);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_88.data_._0_4_ = 3;
  local_80.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"3","b.ReadableBytes()",(int *)&local_88,
             (unsigned_long *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_80.ptr_._0_4_ = 7;
  uVar1 = bidfx_public_api::tools::ByteBuffer::ReadByte();
  local_88.data_._0_4_ = CONCAT31(local_88.data_._1_3_,uVar1);
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"7","b.ReadByte()",(int *)&local_80,(uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xe0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&b);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&a);
  return;
}

Assistant:

TEST(ByteBufferTest, test_copy_constructor_equals_self)
{
    ByteBuffer a(5);
    a.WriteByte(5);
    a.WriteByte(7);
    a.WriteByte(9);
    a.WriteByte(11);
    a.ReadByte(); //Shift the read index away from 0
    ByteBuffer b(a);
    EXPECT_EQ(a, b);
    EXPECT_EQ(3, b.ReadableBytes());
    EXPECT_EQ(7, b.ReadByte());
}